

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::ConfidentialTxIn::GetWitnessHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTxIn *this)

{
  undefined1 uVar1;
  undefined6 in_stack_fffffffffffffeb0;
  ByteData local_148;
  ByteData256 local_130;
  ByteData local_118;
  ByteData256 local_100;
  ByteData local_e8;
  ByteData256 local_d0;
  ByteData local_b8;
  ByteData256 local_a0;
  ByteData local_88;
  ByteData local_70;
  undefined1 local_58 [8];
  ByteData256 empty_data;
  undefined1 local_30 [8];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  ConfidentialTxIn *this_local;
  ByteData256 *result;
  
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30);
  uVar1 = AbstractTxIn::IsCoinBase(&this->super_AbstractTxIn);
  if ((bool)uVar1) {
    ByteData::ByteData(&local_88);
    ByteData::Serialize(&local_70,&local_88);
    HashUtil::Sha256D((ByteData256 *)local_58,&local_70);
    ByteData::~ByteData((ByteData *)0x4a42ed);
    ByteData::~ByteData((ByteData *)0x4a42f6);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               (value_type *)local_58);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               (value_type *)local_58);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               (value_type *)local_58);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               (value_type *)local_58);
    ByteData256::~ByteData256((ByteData256 *)0x4a433b);
  }
  else {
    ByteData::Serialize(&local_b8,&this->issuance_amount_rangeproof_);
    HashUtil::Sha256D(&local_a0,&local_b8);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               &local_a0);
    ByteData256::~ByteData256((ByteData256 *)0x4a43eb);
    ByteData::~ByteData((ByteData *)0x4a43f7);
    ByteData::Serialize(&local_e8,&this->inflation_keys_rangeproof_);
    HashUtil::Sha256D(&local_d0,&local_e8);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               &local_d0);
    ByteData256::~ByteData256((ByteData256 *)0x4a4446);
    ByteData::~ByteData((ByteData *)0x4a4452);
    ScriptWitness::Serialize(&local_118,&(this->super_AbstractTxIn).script_witness_);
    HashUtil::Sha256D(&local_100,&local_118);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               &local_100);
    ByteData256::~ByteData256((ByteData256 *)0x4a449e);
    ByteData::~ByteData((ByteData *)0x4a44aa);
    ScriptWitness::Serialize(&local_148,&this->pegin_witness_);
    HashUtil::Sha256D(&local_130,&local_148);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               &local_130);
    ByteData256::~ByteData256((ByteData256 *)0x4a44f9);
    ByteData::~ByteData((ByteData *)0x4a4505);
  }
  CryptoUtil::ComputeFastMerkleRoot
            (__return_storage_ptr__,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             CONCAT17(1,CONCAT16(uVar1,in_stack_fffffffffffffeb0)));
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTxIn::GetWitnessHash() const {
  std::vector<ByteData256> leaves;
  if (IsCoinBase()) {
    ByteData256 empty_data = HashUtil::Sha256D(ByteData().Serialize());
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
    leaves.push_back(empty_data);
  } else {
    leaves.push_back(
        HashUtil::Sha256D(issuance_amount_rangeproof_.Serialize()));
    leaves.push_back(
        HashUtil::Sha256D(inflation_keys_rangeproof_.Serialize()));
    leaves.push_back(HashUtil::Sha256D(script_witness_.Serialize()));
    leaves.push_back(HashUtil::Sha256D(pegin_witness_.Serialize()));
  }
  ByteData256 result = CryptoUtil::ComputeFastMerkleRoot(leaves);
  return result;
}